

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O1

Reals __thiscall
Omega_h::get_recip_length_weights
          (Omega_h *this,Mesh *mesh,Adj *surf_verts2edges,LOs *edge2surf_edge)

{
  int *piVar1;
  undefined8 uVar2;
  Alloc *pAVar3;
  LO size_in;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar4;
  long lVar5;
  double dVar6;
  Reals RVar7;
  Reals edge2weight;
  Write<double> edge2weight_w;
  type f;
  Reals edge2len;
  undefined1 local_118 [32];
  Alloc *local_f8;
  long local_f0;
  Write<double> local_e8;
  LOs local_d8;
  Alloc *local_c8;
  void *local_c0;
  Alloc *local_b8;
  void *local_b0;
  Alloc *local_a8;
  long local_a0;
  Read<signed_char> local_98;
  Write<double> local_88;
  Alloc *local_78;
  long local_70;
  Alloc *local_68;
  void *pvStack_60;
  Alloc *local_58;
  void *pvStack_50;
  Alloc *local_48;
  long lStack_40;
  Write<double> local_38;
  
  measure_edges_real((Omega_h *)&local_78,mesh);
  size_in = Mesh::nedges(mesh);
  local_118._0_8_ = (Alloc *)(local_118 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"");
  Write<double>::Write(&local_e8,size_in,(string *)local_118);
  if ((Alloc *)local_118._0_8_ != (Alloc *)(local_118 + 0x10)) {
    operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
  }
  local_c8 = (edge2surf_edge->write_).shared_alloc_.alloc;
  if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8 = (Alloc *)(local_c8->size * 8 + 1);
    }
    else {
      local_c8->use_count = local_c8->use_count + 1;
    }
  }
  local_c0 = (edge2surf_edge->write_).shared_alloc_.direct_ptr;
  local_b8 = local_e8.shared_alloc_.alloc;
  if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 && local_e8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_b8 = (Alloc *)((local_e8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_e8.shared_alloc_.alloc)->use_count = (local_e8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_b0 = local_e8.shared_alloc_.direct_ptr;
  local_a8 = local_78;
  if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8 = (Alloc *)(local_78->size * 8 + 1);
    }
    else {
      local_78->use_count = local_78->use_count + 1;
    }
  }
  local_a0 = local_70;
  local_68 = local_c8;
  if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68 = (Alloc *)(local_c8->size * 8 + 1);
    }
    else {
      local_c8->use_count = local_c8->use_count + 1;
    }
  }
  local_58 = local_b8;
  if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58 = (Alloc *)(local_b8->size * 8 + 1);
    }
    else {
      local_b8->use_count = local_b8->use_count + 1;
    }
  }
  pvStack_50 = local_e8.shared_alloc_.direct_ptr;
  local_48 = local_a8;
  if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_48 = (Alloc *)(local_a8->size * 8 + 1);
    }
    else {
      local_a8->use_count = local_a8->use_count + 1;
    }
  }
  lStack_40 = local_70;
  pvStack_60 = local_c0;
  if (0 < size_in) {
    local_118._0_8_ = local_68;
    if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
      local_68->use_count = local_68->use_count + -1;
      local_118._0_8_ = local_68->size * 8 + 1;
    }
    local_68 = (Alloc *)0x0;
    pvStack_60 = (void *)0x0;
    local_118._16_8_ = local_58;
    local_118._24_8_ = local_e8.shared_alloc_.direct_ptr;
    if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
      local_58->use_count = local_58->use_count + -1;
      local_118._16_8_ = local_58->size * 8 + 1;
    }
    local_58 = (Alloc *)0x0;
    pvStack_50 = (void *)0x0;
    local_f8 = local_48;
    local_f0 = local_70;
    if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
      local_48->use_count = local_48->use_count + -1;
      local_f8 = (Alloc *)(local_48->size * 8 + 1);
    }
    local_48 = (Alloc *)0x0;
    lStack_40 = 0;
    entering_parallel = '\0';
    lVar5 = 0;
    do {
      if (*(int *)((long)local_c0 + lVar5 * 4) == -1) {
        dVar6 = 0.0;
      }
      else {
        dVar6 = 1.0 / *(double *)(local_70 + lVar5 * 8);
      }
      *(double *)((long)local_e8.shared_alloc_.direct_ptr + lVar5 * 8) = dVar6;
      lVar5 = lVar5 + 1;
    } while (size_in != (int)lVar5);
    local_118._8_8_ = local_c0;
    get_recip_length_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
              ((__0 *)local_118);
  }
  get_recip_length_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
            ((__0 *)&local_68);
  local_88.shared_alloc_.alloc = local_e8.shared_alloc_.alloc;
  if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 && local_e8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_88.shared_alloc_.alloc = (Alloc *)((local_e8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_e8.shared_alloc_.alloc)->use_count = (local_e8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_88.shared_alloc_.direct_ptr = local_e8.shared_alloc_.direct_ptr;
  Read<double>::Read((Read<signed_char> *)local_118,&local_88);
  pAVar3 = local_88.shared_alloc_.alloc;
  if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 && local_88.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_88.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_88.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_d8.write_.shared_alloc_.alloc =
       (surf_verts2edges->super_Graph).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8.write_.shared_alloc_.alloc =
           (Alloc *)((local_d8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_d8.write_.shared_alloc_.alloc)->use_count =
           (local_d8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_d8.write_.shared_alloc_.direct_ptr =
       (surf_verts2edges->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
  local_98.write_.shared_alloc_.alloc = (Alloc *)local_118._0_8_;
  if ((local_118._0_8_ & 7) == 0 && (Alloc *)local_118._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_118._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_118._0_8_ + 0x30) = *(int *)(local_118._0_8_ + 0x30) + 1;
    }
  }
  local_98.write_.shared_alloc_.direct_ptr = (void *)local_118._8_8_;
  unmap<double>((Omega_h *)&local_38,&local_d8,&local_98,1);
  Read<double>::Read((Read<signed_char> *)this,&local_38);
  if (((ulong)local_38.shared_alloc_.alloc & 7) == 0 && local_38.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_38.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38.shared_alloc_.alloc);
      operator_delete(local_38.shared_alloc_.alloc,0x48);
    }
  }
  pAVar3 = local_98.write_.shared_alloc_.alloc;
  if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_98.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar3);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_d8.write_.shared_alloc_.alloc;
  if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_d8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d8.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  uVar2 = local_118._0_8_;
  if ((local_118._0_8_ & 7) == 0 && (Alloc *)local_118._0_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_118._0_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_118._0_8_);
      operator_delete((void *)uVar2,0x48);
    }
  }
  get_recip_length_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
            ((__0 *)&local_c8);
  pvVar4 = extraout_RDX;
  if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 && local_e8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_e8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_e8.shared_alloc_.alloc);
      operator_delete(local_e8.shared_alloc_.alloc,0x48);
      pvVar4 = extraout_RDX_00;
    }
  }
  if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
    piVar1 = &local_78->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78);
      operator_delete(local_78,0x48);
      pvVar4 = extraout_RDX_01;
    }
  }
  RVar7.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar7.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar7.write_.shared_alloc_;
}

Assistant:

Reals get_recip_length_weights(
    Mesh* mesh, Adj surf_verts2edges, LOs edge2surf_edge) {
  auto edge2len = measure_edges_real(mesh);
  auto nedges = mesh->nedges();
  auto edge2weight_w = Write<Real>(nedges);
  auto f = OMEGA_H_LAMBDA(LO edge) {
    if (edge2surf_edge[edge] == -1)
      edge2weight_w[edge] = 0.0;
    else
      edge2weight_w[edge] = 1.0 / edge2len[edge];
  };
  parallel_for(nedges, f, "get_recip_length_weights");
  auto edge2weight = Reals(edge2weight_w);
  return unmap(surf_verts2edges.ab2b, edge2weight, 1);
}